

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  void *pPtr;
  int iVar1;
  long *in_RDX;
  RenameCtx *in_RSI;
  Parse *in_RDI;
  char *zName;
  int i;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  
  if (in_RDX != (long *)0x0) {
    for (local_24 = 0; local_24 < (int)in_RDX[1]; local_24 = local_24 + 1) {
      pPtr = *(void **)(*in_RDX + (long)local_24 * 0x10);
      iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffc8,(char *)0x1df5c1);
      if (iVar1 == 0) {
        renameTokenFind(in_RDI,in_RSI,pPtr);
      }
    }
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  IdList *pIdList, 
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}